

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void register_comport(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *comList,
                     list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *comList8250,string *dir)

{
  bool bVar1;
  char *__rhs;
  undefined1 local_90 [8];
  string driver;
  string devfile;
  allocator local_29;
  
  get_driver((string *)local_90,dir);
  if (driver._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::string((string *)(devfile.field_2._M_local_buf + 8),"/dev/",&local_29);
    __rhs = basename((dir->_M_dataplus)._M_p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&driver.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&devfile.field_2 + 8),__rhs);
    std::__cxx11::string::~string((string *)(devfile.field_2._M_local_buf + 8));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"serial8250");
    if (bVar1) {
      comList = comList8250;
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(comList,(value_type *)((long)&driver.field_2 + 8));
    std::__cxx11::string::~string((string *)(driver.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void register_comport( list<string>& comList, list<string>& comList8250, const string& dir) {
    // Get the driver the device is using
    string driver = get_driver(dir);

    // Skip devices without a driver
    if (driver.size() > 0) {
        string devfile = string("/dev/") + basename(dir.c_str());

        // Put serial8250-devices in a seperate list
        if (driver == "serial8250") {
            comList8250.push_back(devfile);
        } else
            comList.push_back(devfile);
    }
}